

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::CPPversion(TPpContext *this,TPpToken *ppToken)

{
  uint uVar1;
  TParseContextBase *pTVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  iVar3 = scanToken(this,ppToken);
  if ((this->errorOnVersion != false) || (this->versionSeen == true)) {
    pTVar2 = this->parseContext;
    pcVar5 = "invalid preprocessor command";
    if (((pTVar2->super_TParseVersions).messages & EShMsgReadHlsl) == EShMsgDefault) {
      pcVar5 = "must occur first in shader";
    }
    (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (pTVar2,ppToken,pcVar5,"#version","");
  }
  this->versionSeen = true;
  if (iVar3 != 0x98) {
    if (iVar3 == 10) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must be followed by version number","#version","");
      return 10;
    }
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"must be followed by version number","#version","");
  }
  pcVar5 = ppToken->name;
  uVar4 = atoi(pcVar5);
  (ppToken->field_3).ival = uVar4;
  uVar1 = (ppToken->loc).line;
  iVar3 = scanToken(this,ppToken);
  if (iVar3 == 10) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3c])
              (this->parseContext,(ulong)uVar1,(ulong)uVar4,0);
    return 10;
  }
  iVar3 = TStringAtomMap::getAtom(&this->atomStrings,pcVar5);
  if (iVar3 - 0xb2U < 0xfffffffd) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"bad profile name; use es, core, or compatibility",
               "#version","");
  }
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3c])
            (this->parseContext,(ulong)uVar1,(ulong)uVar4,pcVar5);
  iVar3 = scanToken(this,ppToken);
  if (iVar3 != 10) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"bad tokens following profile -- expected newline",
               "#version","");
    return iVar3;
  }
  return 10;
}

Assistant:

int TPpContext::CPPversion(TPpToken* ppToken)
{
    int token = scanToken(ppToken);

    if (errorOnVersion || versionSeen) {
        if (parseContext.isReadingHLSL())
            parseContext.ppError(ppToken->loc, "invalid preprocessor command", "#version", "");
        else
            parseContext.ppError(ppToken->loc, "must occur first in shader", "#version", "");
    }
    versionSeen = true;

    if (token == '\n') {
        parseContext.ppError(ppToken->loc, "must be followed by version number", "#version", "");

        return token;
    }

    if (token != PpAtomConstInt)
        parseContext.ppError(ppToken->loc, "must be followed by version number", "#version", "");

    ppToken->ival = atoi(ppToken->name);
    int versionNumber = ppToken->ival;
    int line = ppToken->loc.line;
    token = scanToken(ppToken);

    if (token == '\n') {
        parseContext.notifyVersion(line, versionNumber, nullptr);
        return token;
    } else {
        int profileAtom = atomStrings.getAtom(ppToken->name);
        if (profileAtom != PpAtomCore &&
            profileAtom != PpAtomCompatibility &&
            profileAtom != PpAtomEs)
            parseContext.ppError(ppToken->loc, "bad profile name; use es, core, or compatibility", "#version", "");
        parseContext.notifyVersion(line, versionNumber, ppToken->name);
        token = scanToken(ppToken);

        if (token == '\n')
            return token;
        else
            parseContext.ppError(ppToken->loc, "bad tokens following profile -- expected newline", "#version", "");
    }

    return token;
}